

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  int iVar2;
  Message *pMVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  MessageLite *this_00;
  UnknownFieldSet *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  scoped_ptr<google::protobuf::Message> dynamic;
  string serial;
  AggregateErrorCollector collector;
  LogMessage local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Parser parser;
  AggregateOptionFinder finder;
  
  if ((this->uninterpreted_option_->_has_bits_[0] & 0x40) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&finder,
                   "Option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&finder,
                   "\" is a message. To set the entire message, use syntax like \"");
    std::operator+(&serial,&local_90,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    option_field);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                   &serial,
                   " = { <proto text format> }\". To set fields within it, use syntax like \"");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collector,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    option_field);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collector,
                   ".foo = value\".");
    bVar1 = AddValueError(this,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&collector);
    std::__cxx11::string::~string((string *)&parser);
    std::__cxx11::string::~string((string *)&serial);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&finder);
  }
  else {
    pMVar3 = DynamicMessageFactory::GetPrototype
                       (&this->dynamic_factory_,*(Descriptor **)(option_field + 0x48));
    iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3);
    pMVar3 = (Message *)CONCAT44(extraout_var,iVar2);
    dynamic.ptr_ = pMVar3;
    if (pMVar3 == (Message *)0x0) {
      internal::LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                 ,0x12e9);
      pLVar4 = internal::LogMessage::operator<<(&local_c8,"CHECK failed: dynamic.get() != NULL: ");
      pLVar4 = internal::LogMessage::operator<<(pLVar4,"Could not create an instance of ");
      FieldDescriptor::DebugString_abi_cxx11_((string *)&collector,option_field);
      pLVar4 = internal::LogMessage::operator<<(pLVar4,(string *)&collector);
      internal::LogFinisher::operator=((LogFinisher *)&parser,pLVar4);
      std::__cxx11::string::~string((string *)&collector);
      internal::LogMessage::~LogMessage(&local_c8);
    }
    collector.error_._M_dataplus._M_p = (pointer)&collector.error_.field_2;
    collector.super_ErrorCollector._vptr_ErrorCollector =
         (_func_int **)&PTR__AggregateErrorCollector_00297978;
    collector.error_._M_string_length = 0;
    collector.error_.field_2._M_local_buf[0] = '\0';
    finder.super_Finder._vptr_Finder = (_func_int **)&PTR__Finder_002979c0;
    finder.builder_ = this->builder_;
    TextFormat::Parser::Parser(&parser);
    parser.error_collector_ = &collector.super_ErrorCollector;
    parser.finder_ = &finder.super_Finder;
    bVar1 = TextFormat::Parser::ParseFromString
                      (&parser,this->uninterpreted_option_->aggregate_value_,pMVar3);
    if (bVar1) {
      serial._M_dataplus._M_p = (pointer)&serial.field_2;
      serial._M_string_length = 0;
      serial.field_2._M_local_buf[0] = '\0';
      this_00 = &internal::scoped_ptr<google::protobuf::Message>::operator->(&dynamic)->
                 super_MessageLite;
      MessageLite::SerializeToString(this_00,&serial);
      if (*(int *)(option_field + 0x2c) == 0xb) {
        UnknownFieldSet::AddLengthDelimited(unknown_fields,*(int *)(option_field + 0x28),&serial);
      }
      else {
        if (*(int *)(option_field + 0x2c) != 10) {
          internal::LogMessage::LogMessage
                    (&local_c8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                     ,0x12fd);
          pLVar4 = internal::LogMessage::operator<<
                             (&local_c8,
                              "CHECK failed: (option_field->type()) == (FieldDescriptor::TYPE_GROUP): "
                             );
          internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar4);
          internal::LogMessage::~LogMessage(&local_c8);
        }
        this_01 = UnknownFieldSet::AddGroup(unknown_fields,*(int *)(option_field + 0x28));
        UnknownFieldSet::ParseFromString(this_01,&serial);
      }
      this_02 = &serial;
    }
    else {
      std::operator+(&local_90,"Error while parsing option value for \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      option_field);
      std::operator+(&serial,&local_90,"\": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                     &serial,&collector.error_);
      AddValueError(this,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&serial);
      this_02 = &local_90;
    }
    std::__cxx11::string::~string((string *)this_02);
    TextFormat::Parser::~Parser(&parser);
    TextFormat::Finder::~Finder(&finder.super_Finder);
    anon_unknown_1::AggregateErrorCollector::~AggregateErrorCollector(&collector);
    if (dynamic.ptr_ != (Message *)0x0) {
      (*((dynamic.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  return bVar1;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetAggregateOption(
    const FieldDescriptor* option_field,
    UnknownFieldSet* unknown_fields) {
  if (!uninterpreted_option_->has_aggregate_value()) {
    return AddValueError("Option \"" + option_field->full_name() +
                         "\" is a message. To set the entire message, use "
                         "syntax like \"" + option_field->name() +
                         " = { <proto text format> }\". "
                         "To set fields within it, use "
                         "syntax like \"" + option_field->name() +
                         ".foo = value\".");
  }

  const Descriptor* type = option_field->message_type();
  scoped_ptr<Message> dynamic(dynamic_factory_.GetPrototype(type)->New());
  GOOGLE_CHECK(dynamic.get() != NULL)
      << "Could not create an instance of " << option_field->DebugString();

  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  finder.builder_ = builder_;
  TextFormat::Parser parser;
  parser.RecordErrorsTo(&collector);
  parser.SetFinder(&finder);
  if (!parser.ParseFromString(uninterpreted_option_->aggregate_value(),
                              dynamic.get())) {
    AddValueError("Error while parsing option value for \"" +
                  option_field->name() + "\": " + collector.error_);
    return false;
  } else {
    string serial;
    dynamic->SerializeToString(&serial);  // Never fails
    if (option_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      unknown_fields->AddLengthDelimited(option_field->number(), serial);
    } else {
      GOOGLE_CHECK_EQ(option_field->type(),  FieldDescriptor::TYPE_GROUP);
      UnknownFieldSet* group = unknown_fields->AddGroup(option_field->number());
      group->ParseFromString(serial);
    }
    return true;
  }
}